

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

int __thiscall ncnn::Log::forward_inplace(Log *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  int i_1;
  float *ptr_1;
  int q_1;
  float log_base_inv;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  float *in_stack_ffffffffffffff00;
  Mat *in_stack_ffffffffffffff08;
  Mat *this_00;
  int local_dc;
  Mat local_d8;
  float *local_98;
  int local_90;
  float local_8c;
  int local_88;
  Mat local_78;
  float *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x34);
  local_28 = local_1c * local_20;
  if ((*(float *)(in_RDI + 0xb8) != -1.0) || (NAN(*(float *)(in_RDI + 0xb8)))) {
    dVar2 = std::log((double)(ulong)*(uint *)(in_RDI + 0xb8));
    local_8c = 1.0 / SUB84(dVar2,0);
    for (local_90 = 0; local_90 < local_24; local_90 = local_90 + 1) {
      Mat::channel(in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      in_stack_ffffffffffffff00 = Mat::operator_cast_to_float_(&local_d8);
      Mat::~Mat((Mat *)0x167c83);
      local_98 = in_stack_ffffffffffffff00;
      for (local_dc = 0; local_dc < local_28; local_dc = local_dc + 1) {
        dVar2 = std::log((double)(ulong)(uint)(*(float *)(in_RDI + 0xc0) +
                                              local_98[local_dc] * *(float *)(in_RDI + 0xbc)));
        local_98[local_dc] = SUB84(dVar2,0) * local_8c;
      }
    }
  }
  else {
    for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
      this_00 = &local_78;
      Mat::channel(this_00,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      pfVar1 = Mat::operator_cast_to_float_(this_00);
      Mat::~Mat((Mat *)0x167b45);
      local_38 = pfVar1;
      for (local_88 = 0; local_88 < local_28; local_88 = local_88 + 1) {
        dVar2 = std::log((double)(ulong)(uint)(*(float *)(in_RDI + 0xc0) +
                                              local_38[local_88] * *(float *)(in_RDI + 0xbc)));
        local_38[local_88] = SUB84(dVar2,0);
      }
    }
  }
  return 0;
}

Assistant:

int Log::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (base == -1.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = static_cast<float>(log(shift + ptr[i] * scale));
            }
        }
    }
    else
    {
        float log_base_inv = static_cast<float>(1.f / log(base));

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = static_cast<float>(log(shift + ptr[i] * scale) * log_base_inv);
            }
        }
    }

    return 0;
}